

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix4d *
tinyusdz::trs_rot_axis
          (matrix4d *__return_storage_ptr__,double3 *translation,double3 *rotation_x_axis,
          double3 *rotation_y_axis,double3 *rotation_z_axis,double3 *scale)

{
  bool result_valid;
  matrix4d orMat;
  matrix4d m;
  matrix4d ret;
  matrix4d m_2;
  matrix4d m_1;
  bool local_2b9;
  matrix4d local_2b8;
  matrix4d local_238;
  value local_1b0 [128];
  double local_130 [6];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  double local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  matrix4d local_b0;
  
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  local_238.m[0][3] = 0.0;
  local_238.m[1][3] = 0.0;
  local_238.m[2][3] = 0.0;
  local_238.m[3][0] = 0.0;
  local_238.m[3][1] = 0.0;
  local_238.m[3][2] = 0.0;
  local_238.m[3][3] = 1.0;
  local_238.m[0][0] = rotation_x_axis->_M_elems[0];
  local_238.m[0][1] = rotation_x_axis->_M_elems[1];
  local_238.m[0][2] = rotation_x_axis->_M_elems[2];
  local_238.m[1][0] = rotation_y_axis->_M_elems[0];
  local_238.m[1][1] = rotation_y_axis->_M_elems[1];
  local_238.m[1][2] = rotation_y_axis->_M_elems[2];
  local_238.m[2][0] = rotation_z_axis->_M_elems[0];
  local_238.m[2][1] = rotation_z_axis->_M_elems[1];
  local_238.m[2][2] = rotation_z_axis->_M_elems[2];
  local_2b9 = true;
  orthonormalize(&local_2b8,&local_238,&local_2b9);
  local_b0.m[0][0] = 1.0;
  local_b0.m[0][1] = 0.0;
  local_b0.m[0][2] = 0.0;
  local_b0.m[0][3] = 0.0;
  local_b0.m[1][0] = 0.0;
  local_b0.m[1][1] = 1.0;
  local_b0.m[1][2] = 0.0;
  local_b0.m[1][3] = 0.0;
  local_b0.m[2][0] = 0.0;
  local_b0.m[2][1] = 0.0;
  local_b0.m[2][2] = 1.0;
  local_b0.m[2][3] = 0.0;
  local_b0.m[3][3] = 1.0;
  local_b0.m[3][0] = translation->_M_elems[0];
  local_b0.m[3][1] = translation->_M_elems[1];
  local_b0.m[3][2] = translation->_M_elems[2];
  local_130[3] = 0.0;
  local_130[4] = 0.0;
  local_130[1] = 0.0;
  local_130[2] = 0.0;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0x3ff0000000000000;
  local_130[0] = scale->_M_elems[0];
  local_130[5] = scale->_M_elems[1];
  local_e0 = scale->_M_elems[2];
  value::Mult<tinyusdz::value::matrix4d,double,4ul>
            ((matrix4d *)local_1b0,(value *)local_130,&local_2b8,(matrix4d *)rotation_y_axis);
  value::Mult<tinyusdz::value::matrix4d,double,4ul>
            (__return_storage_ptr__,local_1b0,&local_b0,(matrix4d *)rotation_y_axis);
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d trs_rot_axis(const value::double3 &translation,
                             const value::double3 &rotation_x_axis,
                             const value::double3 &rotation_y_axis,
                             const value::double3 &rotation_z_axis,
                             const value::double3 &scale) {
  value::matrix4d m{value::matrix4d::identity()};

  value::matrix4d rMat{value::matrix4d::identity()};
  rMat.m[0][0] = rotation_x_axis[0];
  rMat.m[0][1] = rotation_x_axis[1];
  rMat.m[0][2] = rotation_x_axis[2];
  rMat.m[1][0] = rotation_y_axis[0];
  rMat.m[1][1] = rotation_y_axis[1];
  rMat.m[1][2] = rotation_y_axis[2];
  rMat.m[2][0] = rotation_z_axis[0];
  rMat.m[2][1] = rotation_z_axis[1];
  rMat.m[2][2] = rotation_z_axis[2];

  bool result_valid{true};
  value::matrix4d orMat = orthonormalize(rMat, &result_valid);
  // TODO: report error when orthonormalize failed.

  value::matrix4d tMat{value::matrix4d::identity()};
  tMat.m[3][0] = translation[0];
  tMat.m[3][1] = translation[1];
  tMat.m[3][2] = translation[2];

  value::matrix4d sMat{value::matrix4d::identity()};
  sMat.m[0][0] = scale[0];
  sMat.m[1][1] = scale[1];
  sMat.m[2][2] = scale[2];

  m = sMat * orMat * tMat;

  return m;
}